

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

void Abc_AigPrintNode(Abc_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Abc_Obj_t *pNode_00;
  char *pcVar5;
  
  pNode_00 = (Abc_Obj_t *)((ulong)pNode & 0xfffffffffffffffe);
  uVar1 = *(uint *)&pNode_00->field_0x14 & 0xf;
  if ((uVar1 != 5) && (uVar1 != 2)) {
    iVar2 = Abc_AigNodeIsConst(pNode_00);
    if (iVar2 != 0) {
      pcVar3 = "(complemented)";
      if (((ulong)pNode & 1) == 0) {
        pcVar3 = "";
      }
      printf("Constant 1 %s.\n",pcVar3);
      return;
    }
    pcVar3 = Abc_ObjName(pNode_00);
    pcVar5 = "\'";
    pcVar4 = "\'";
    if (((ulong)pNode & 1) == 0) {
      pcVar4 = "";
    }
    printf("%7s%s",pcVar3,pcVar4);
    printf(" = ");
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray]);
    pcVar4 = "\'";
    if ((*(uint *)&pNode_00->field_0x14 >> 10 & 1) == 0) {
      pcVar4 = "";
    }
    printf("%7s%s",pcVar3,pcVar4);
    printf(" * ");
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[(pNode_00->vFanins).pArray[1]]);
    if ((*(uint *)&pNode_00->field_0x14 >> 0xb & 1) == 0) {
      pcVar5 = "";
    }
    printf("%7s%s",pcVar3,pcVar5);
    putchar(10);
    return;
  }
  pcVar3 = Abc_ObjName(pNode_00);
  pcVar4 = "\'";
  if (((ulong)pNode & 1) == 0) {
    pcVar4 = "";
  }
  printf("CI %4s%s.\n",pcVar3,pcVar4);
  return;
}

Assistant:

void Abc_AigPrintNode( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNodeR = Abc_ObjRegular(pNode);
    if ( Abc_ObjIsCi(pNodeR) )
    {
        printf( "CI %4s%s.\n", Abc_ObjName(pNodeR), Abc_ObjIsComplement(pNode)? "\'" : "" );
        return;
    }
    if ( Abc_AigNodeIsConst(pNodeR) )
    {
        printf( "Constant 1 %s.\n", Abc_ObjIsComplement(pNode)? "(complemented)" : ""  );
        return;
    }
    // print the node's function
    printf( "%7s%s", Abc_ObjName(pNodeR),                Abc_ObjIsComplement(pNode)? "\'" : "" );
    printf( " = " );
    printf( "%7s%s", Abc_ObjName(Abc_ObjFanin0(pNodeR)), Abc_ObjFaninC0(pNodeR)?     "\'" : "" );
    printf( " * " );
    printf( "%7s%s", Abc_ObjName(Abc_ObjFanin1(pNodeR)), Abc_ObjFaninC1(pNodeR)?     "\'" : "" );
    printf( "\n" );
}